

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

void pg::freeze_thaw_reset_rec_SPAWN
               (WorkerP *w,Task *__dq_head,FPISolver *arg_1,int arg_2,int arg_3,int arg_4)

{
  Worker *pWVar1;
  int iVar2;
  uint __i;
  Worker *wt;
  uint32_t newsplit;
  uint32_t split;
  uint32_t head;
  TailSplitNA ts;
  TD_freeze_thaw_reset_rec *t;
  int arg_4_local;
  int arg_3_local;
  int arg_2_local;
  FPISolver *arg_1_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  if (__dq_head == w->end) {
    lace_abort_stack_overflow();
  }
  __dq_head->f = freeze_thaw_reset_rec_WRAP;
  std::atomic_store_explicit<_Worker*>
            (&__dq_head->thief,(__atomic_val_t<_Worker_*>)&DAT_00000001,memory_order_relaxed);
  *(FPISolver **)__dq_head->d = arg_1;
  *(int *)(__dq_head->d + 8) = arg_2;
  *(int *)(__dq_head->d + 0xc) = arg_3;
  *(int *)(__dq_head->d + 0x10) = arg_4;
  pWVar1 = w->_public;
  if (w->allstolen == '\0') {
    if (pWVar1->movesplit != '\0') {
      __i = (int)((long)w->split - (long)w->dq >> 6) + (int)((long)__dq_head - (long)w->dq >> 6) +
            2U >> 1;
      std::__atomic_base<unsigned_int>::operator=
                (&(pWVar1->ts).ts.split.super___atomic_base<unsigned_int>,__i);
      w->split = w->dq + __i;
      pWVar1->movesplit = '\0';
    }
  }
  else {
    if (pWVar1->movesplit != '\0') {
      pWVar1->movesplit = '\0';
    }
    iVar2 = (int)((long)__dq_head - (long)w->dq >> 6);
    std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)&(pWVar1->ts).ts,CONCAT44(iVar2 + 1,iVar2));
    pWVar1->allstolen = '\0';
    w->split = __dq_head + 1;
    w->allstolen = '\0';
  }
  return;
}

Assistant:

VOID_TASK_4(freeze_thaw_reset_rec, FPISolver*, solver, int, i, int, n, int, p)
{
    if (n>128) {
        // because dynamic bitset is not thread safe, work in blocks of 64...
        if (i&127) {
            // start not yet aligned
            int N = 128 - (i&127);
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            solver->freezeThawReset(i, N, p);
            SYNC(freeze_thaw_reset_rec);
        } else {
            int N = (n/128)*64;
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            CALL(freeze_thaw_reset_rec, solver, i, N, p);
            SYNC(freeze_thaw_reset_rec);
        }
    } else {
        solver->freezeThawReset(i, n, p);
    }
}